

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  float fVar1;
  float fVar2;
  char cVar3;
  byte bVar4;
  undefined2 uVar5;
  ImGuiTableColumn *pIVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  ImU32 id;
  char *pcVar13;
  byte *pbVar14;
  ulong uVar15;
  short sVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  ImGuiTableColumn *pIVar20;
  ulong uVar21;
  int iVar22;
  ImGuiTableColumn *pIVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ImGuiContext *g;
  ImRect host_clip_rect;
  ImRect mouse_hit_rect;
  float local_a4;
  float local_a0;
  ImRect local_68;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar8 = GImGui;
  if (table->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                  ,0x2145,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  fVar26 = (table->WorkRect).Min.x;
  fVar1 = (table->WorkRect).Min.y;
  fVar28 = (table->WorkRect).Max.x;
  fVar25 = table->CellPaddingX2;
  fVar2 = table->CellSpacingX;
  fVar29 = (pIVar8->Style).FramePadding.x * 3.0;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  table->ColumnsAutoFitWidth = 0.0;
  uVar11 = table->ColumnsCount;
  if ((int)uVar11 < 1) {
    local_a0 = 0.0;
    local_a4 = 0.0;
  }
  else {
    local_58 = ZEXT416((uint)(fVar29 * 4.0));
    uVar21 = 0;
    local_a4 = 0.0;
    local_a0 = 0.0;
    do {
      if ((table->VisibleMaskByDisplayOrder >> (uVar21 & 0x3f) & 1) != 0) {
        pcVar13 = (table->DisplayOrderToIndex).Data + uVar21;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar13) goto LAB_001c0341;
        cVar3 = *pcVar13;
        pIVar23 = (table->Columns).Data + cVar3;
        if ((table->Columns).DataEnd <= pIVar23) goto LAB_001c032a;
        uVar11 = TableFixColumnFlags(table,pIVar23->FlagsIn);
        uVar17 = (uint)(cVar3 != '\0') * 0x4000 + 0x4000;
        if ((uVar11 & 0xc000) != 0) {
          uVar17 = 0;
        }
        pIVar23->Flags = uVar17 | uVar11;
        if ((table->Flags & 8) != 0) {
          TableFixColumnSortDirection(pIVar23);
        }
        uVar5 = pIVar23->ContentWidthRowsFrozen;
        sVar16 = pIVar23->ContentWidthRowsUnfrozen;
        if (pIVar23->ContentWidthRowsUnfrozen < (short)uVar5) {
          sVar16 = uVar5;
        }
        fVar27 = (float)(int)sVar16;
        if (((table->Flags & 0x8000) == 0) && ((pIVar23->Flags & 0x800) == 0)) {
          uVar11 = -(uint)((float)(int)pIVar23->ContentWidthHeadersIdeal <= fVar27);
          fVar27 = (float)((uint)fVar27 & uVar11 |
                          ~uVar11 & (uint)(float)(int)pIVar23->ContentWidthHeadersIdeal);
        }
        fVar27 = fVar27 + fVar25;
        uVar11 = -(uint)(fVar29 <= fVar27);
        fVar27 = (float)(~uVar11 & (uint)fVar29 | (uint)fVar27 & uVar11);
        table->ColumnsAutoFitWidth = table->ColumnsAutoFitWidth + fVar27;
        uVar11 = pIVar23->Flags;
        if ((uVar11 & 0x14) == 0) {
          if ((uVar11 & 8) == 0) {
            __assert_fail("column->Flags & ImGuiTableColumnFlags_WidthStretch",
                          "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_widgets.cpp"
                          ,0x2187,"void ImGui::TableUpdateLayout(ImGuiTable *)");
          }
          if (pIVar23->WidthStretchWeight <= 0.0 && pIVar23->WidthStretchWeight != 0.0) {
            pIVar23->WidthStretchWeight = 1.0;
          }
          local_a4 = local_a4 + pIVar23->WidthStretchWeight;
          if (table->LeftMostStretchedColumnDisplayOrder == -1) {
            table->LeftMostStretchedColumnDisplayOrder = pIVar23->DisplayOrder;
          }
        }
        else {
          if ((((uVar11 & 0x10) != 0 || pIVar23->AutoFitQueue != '\0') &&
              (pIVar23->WidthRequest = fVar27, '\x01' < pIVar23->AutoFitQueue)) &&
             (table->IsInitializing == true)) {
            pIVar23->WidthRequest =
                 (float)(~-(uint)((float)local_58._0_4_ <= fVar27) & local_58._0_4_ |
                        -(uint)((float)local_58._0_4_ <= fVar27) & (uint)fVar27);
          }
          local_a0 = local_a0 + pIVar23->WidthRequest;
        }
      }
      uVar21 = uVar21 + 1;
      uVar11 = table->ColumnsCount;
    } while ((long)uVar21 < (long)(int)uVar11);
  }
  fVar25 = (float)(table->ColumnsVisibleCount + -1);
  table->ColumnsAutoFitWidth = fVar2 * 3.0 * fVar25 + table->ColumnsAutoFitWidth;
  fVar25 = fVar25 * table->CellSpacingX;
  if ((((table->Flags & 0x40000) == 0) || (table->InnerWidth != 0.0)) || (NAN(table->InnerWidth))) {
    fVar28 = fVar28 - fVar26;
  }
  else {
    fVar28 = (table->InnerClipRect).Max.x - (table->InnerClipRect).Min.x;
  }
  local_a0 = (fVar28 - fVar25) - local_a0;
  table->ColumnsTotalWidth = fVar25;
  if ((int)uVar11 < 1) {
    bVar24 = true;
  }
  else {
    uVar21 = table->VisibleMaskByDisplayOrder;
    uVar18 = 0;
    iVar19 = 0;
    fVar28 = local_a0;
    do {
      if ((uVar21 >> (uVar18 & 0x3f) & 1) != 0) {
        pcVar13 = (table->DisplayOrderToIndex).Data + uVar18;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar13) goto LAB_001c0341;
        pIVar23 = (table->Columns).Data;
        pIVar6 = (table->Columns).DataEnd;
        pIVar20 = pIVar23 + *pcVar13;
        if (pIVar6 <= pIVar20) goto LAB_001c032a;
        if ((pIVar20->Flags & 8U) != 0) {
          fVar25 = (pIVar20->WidthStretchWeight / local_a4) * local_a0;
          uVar17 = -(uint)(fVar29 <= fVar25);
          fVar25 = (float)(int)((float)(~uVar17 & (uint)fVar29 | (uint)fVar25 & uVar17) + 0.01);
          pIVar20->WidthRequest = fVar25;
          fVar28 = fVar28 - fVar25;
          if ((long)pIVar20->NextVisibleColumn != -1) {
            pIVar23 = pIVar23 + pIVar20->NextVisibleColumn;
            if (pIVar6 <= pIVar23) goto LAB_001c032a;
            uVar17 = pIVar23->Flags;
            if ((uVar17 & 4) != 0) {
              pIVar20->Flags = uVar17 & 0x100000 | pIVar20->Flags;
            }
          }
        }
        if ((pIVar20->NextVisibleColumn == -1) && (table->LeftMostStretchedColumnDisplayOrder != -1)
           ) {
          pbVar14 = (byte *)((long)&pIVar20->Flags + 2);
          *pbVar14 = *pbVar14 | 0x10;
        }
        iVar19 = iVar19 + (uint)((pIVar20->Flags & 0x20U) == 0);
        uVar17 = -(uint)(fVar29 <= pIVar20->WidthRequest);
        fVar25 = (float)(int)(float)(~uVar17 & (uint)fVar29 | (uint)pIVar20->WidthRequest & uVar17);
        pIVar20->WidthGiven = fVar25;
        table->ColumnsTotalWidth = fVar25 + table->ColumnsTotalWidth;
      }
      uVar18 = uVar18 + 1;
    } while (uVar11 != uVar18);
    bVar24 = iVar19 == 0;
    local_a0 = fVar28;
  }
  if ((((1.0 <= local_a0) && (1.0 <= local_a0)) && (0 < (int)uVar11)) && (0.0 < local_a4)) {
    uVar21 = table->VisibleMaskByDisplayOrder;
    uVar18 = (ulong)uVar11;
    do {
      uVar15 = uVar18 - 1;
      if ((uVar21 >> (uVar15 & 0x3f) & 1) != 0) {
        pcVar13 = (table->DisplayOrderToIndex).Data + uVar15;
        if ((table->DisplayOrderToIndex).DataEnd <= pcVar13) goto LAB_001c0341;
        pIVar23 = (table->Columns).Data + *pcVar13;
        if ((table->Columns).DataEnd <= pIVar23) goto LAB_001c032a;
        if ((pIVar23->Flags & 8) != 0) {
          pIVar23->WidthRequest = pIVar23->WidthRequest + 1.0;
          pIVar23->WidthGiven = pIVar23->WidthGiven + 1.0;
          local_a0 = local_a0 + -1.0;
        }
      }
    } while (((0.0 < local_a4) && (1.0 <= local_a0)) &&
            (bVar9 = 1 < (long)uVar18, uVar18 = uVar15, bVar9));
  }
  local_40.Min.x = (table->OuterRect).Min.x;
  local_40.Min.y = (table->OuterRect).Min.y;
  local_40.Max.x = (table->OuterRect).Max.x;
  fVar28 = (table->OuterRect).Max.y;
  fVar25 = table->LastOuterHeight + local_40.Min.y;
  uVar11 = -(uint)(fVar25 <= fVar28);
  local_40.Max.y = (float)(uVar11 & (uint)fVar28 | ~uVar11 & (uint)fVar25);
  bVar9 = ItemHoverable(&local_40,0);
  fVar28 = fVar26;
  if ('\0' < table->FreezeColumnsCount) {
    fVar28 = (table->OuterRect).Min.x;
  }
  local_68.Min = (table->InnerClipRect).Min;
  local_68.Max = (table->InnerClipRect).Max;
  uVar21 = (ulong)(uint)table->ColumnsCount;
  if (0 < table->ColumnsCount) {
    iVar22 = 0;
    uVar18 = 0;
    iVar19 = 0;
    do {
      pbVar14 = (byte *)((table->DisplayOrderToIndex).Data + uVar18);
      if ((table->DisplayOrderToIndex).DataEnd <= pbVar14) goto LAB_001c0341;
      bVar4 = *pbVar14;
      pIVar23 = (table->Columns).Data + (char)bVar4;
      if ((table->Columns).DataEnd <= pIVar23) goto LAB_001c032a;
      if (iVar19 == table->FreezeColumnsCount && '\0' < table->FreezeColumnsCount) {
        fVar28 = fVar28 + (fVar26 - (table->OuterRect).Min.x);
      }
      if ((table->VisibleMaskByDisplayOrder >> (uVar18 & 0x3f) & 1) == 0) {
        pIVar23->MaxX = fVar28;
        pIVar23->MinX = fVar28;
        pIVar23->StartXHeaders = fVar28;
        pIVar23->StartXRows = fVar28;
        pIVar23->WidthGiven = 0.0;
        (pIVar23->ClipRect).Min.x = fVar28;
        (pIVar23->ClipRect).Min.y = fVar1;
        (pIVar23->ClipRect).Max.x = fVar28;
        (pIVar23->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar23->ClipRect,&local_68);
        pIVar23->IsClipped = true;
        pIVar23->SkipItems = true;
      }
      else {
        if (((uint)table->Flags >> 0x12 & 1) == 0) {
          fVar25 = 3.4028235e+38;
          if (((uint)table->Flags >> 0x11 & 1) == 0) {
            iVar12 = ~(int)pIVar23->IndexWithinVisibleSet + table->ColumnsVisibleCount;
            fVar25 = (table->WorkRect).Max.x;
LAB_001bff6d:
            fVar25 = fVar25 - (float)iVar12 * fVar29;
          }
        }
        else {
          fVar25 = 3.4028235e+38;
          if ((long)uVar18 < (long)table->FreezeColumnsRequest) {
            iVar12 = table->FreezeColumnsRequest + iVar22;
            fVar25 = (table->InnerClipRect).Max.x;
            goto LAB_001bff6d;
          }
        }
        if (fVar25 < pIVar23->WidthGiven + fVar28) {
          uVar11 = -(uint)(fVar29 <= fVar25 - fVar28);
          pIVar23->WidthGiven = (float)(~uVar11 & (uint)fVar29 | (uint)(fVar25 - fVar28) & uVar11);
        }
        pIVar23->MinX = fVar28;
        fVar25 = pIVar23->WidthGiven + fVar28;
        pIVar23->MaxX = fVar25;
        (pIVar23->ClipRect).Min.x = fVar28;
        (pIVar23->ClipRect).Min.y = fVar1;
        (pIVar23->ClipRect).Max.x = fVar25;
        (pIVar23->ClipRect).Max.y = 3.4028235e+38;
        ImRect::ClipWithFull(&pIVar23->ClipRect,&local_68);
        fVar25 = (pIVar23->ClipRect).Min.x;
        if ((fVar25 < (pIVar23->ClipRect).Max.x) || ((pIVar23->AutoFitQueue & 1U) != 0)) {
          pIVar23->IsClipped = false;
        }
        else {
          pIVar23->IsClipped = (bool)(~pIVar23->CannotSkipItemsQueue & 1);
          if ((pIVar23->CannotSkipItemsQueue & 1U) == 0) {
            table->VisibleUnclippedMaskByIndex =
                 table->VisibleUnclippedMaskByIndex &
                 (-2L << (bVar4 & 0x3f) | 0xfffffffffffffffeU >> 0x40 - (bVar4 & 0x3f));
          }
        }
        bVar10 = true;
        if (pIVar23->IsVisible == true) {
          bVar10 = table->HostSkipItems;
        }
        pIVar23->SkipItems = bVar10;
        if (((bVar9) && (fVar2 = (pIVar8->IO).MousePos.x, fVar25 <= fVar2)) &&
           (fVar2 < (pIVar23->ClipRect).Max.x)) {
          table->HoveredColumnBody = bVar4;
        }
        fVar25 = pIVar23->MinX + table->CellPaddingX1;
        pIVar23->StartXHeaders = fVar25;
        pIVar23->StartXRows = fVar25;
        pIVar23->ContentMaxPosRowsUnfrozen = fVar25;
        pIVar23->ContentMaxPosRowsFrozen = fVar25;
        pIVar23->ContentMaxPosHeadersIdeal = fVar25;
        pIVar23->ContentMaxPosHeadersUsed = fVar25;
        if (table->HostSkipItems == false) {
          pIVar23->AutoFitQueue = pIVar23->AutoFitQueue >> 1;
          pIVar23->CannotSkipItemsQueue = pIVar23->CannotSkipItemsQueue >> 1;
        }
        if (iVar19 < table->FreezeColumnsCount) {
          fVar25 = pIVar23->MaxX + 2.0;
          uVar11 = -(uint)(fVar25 <= local_68.Min.x);
          local_68.Min.x = (float)(~uVar11 & (uint)fVar25 | (uint)local_68.Min.x & uVar11);
        }
        fVar28 = fVar28 + pIVar23->WidthGiven + table->CellSpacingX;
        iVar19 = iVar19 + 1;
      }
      uVar18 = uVar18 + 1;
      uVar21 = (ulong)table->ColumnsCount;
      iVar22 = iVar22 + -1;
    } while ((long)uVar18 < (long)uVar21);
  }
  if ((bVar9) && (table->HoveredColumnBody == -1)) {
    fVar26 = (table->WorkRect).Min.x;
    if ((long)table->RightMostVisibleColumn != -1) {
      pIVar23 = (table->Columns).Data + table->RightMostVisibleColumn;
      if ((table->Columns).DataEnd <= pIVar23) {
LAB_001c032a:
        pcVar13 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
        goto LAB_001c0356;
      }
      fVar1 = (pIVar23->ClipRect).Max.x;
      uVar11 = -(uint)(fVar1 <= fVar26);
      fVar26 = (float)((uint)fVar26 & uVar11 | ~uVar11 & (uint)fVar1);
    }
    if (fVar26 <= (pIVar8->IO).MousePos.x) {
      table->HoveredColumnBody = (ImS8)uVar21;
    }
  }
  if ((bVar24) && ((table->Flags & 1U) != 0)) {
    table->Flags = table->Flags & 0xfffffffe;
  }
  TableUpdateDrawChannels(table);
  if ((table->Flags & 1) != 0) {
    TableUpdateBorders(table);
  }
  table->LastFirstRowHeight = 0.0;
  table->IsLayoutLocked = true;
  table->IsUsingHeaders = false;
  if ((table->IsContextPopupOpen == true) && (table->InstanceCurrent == table->InstanceInteracted))
  {
    id = ImHashStr("##ContextMenu",0,table->ID);
    bVar24 = BeginPopupEx(id,0x141);
    if (bVar24) {
      TableDrawContextMenu(table);
      EndPopup();
    }
    else {
      table->IsContextPopupOpen = false;
    }
  }
  pIVar7 = table->InnerWindow;
  if ((table->Flags & 0x1000) == 0) {
    ImDrawList::PushClipRect(pIVar7->DrawList,(pIVar7->ClipRect).Min,(pIVar7->ClipRect).Max,false);
  }
  else {
    ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar7->DrawList,1);
  }
  if ((table->IsSortSpecsDirty == true) && ((table->Flags & 8) != 0)) {
    TableSortSpecsBuild(table);
  }
  return;
LAB_001c0341:
  pcVar13 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_001c0356:
  __assert_fail("p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui_internal.h"
                ,0x20a,pcVar13);
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float padding_auto_x = table->CellPaddingX2;
    const float spacing_auto_x = table->CellSpacingX * (1.0f + 2.0f); // CellSpacingX is >0.0f when there's no vertical border, in which case we add two extra CellSpacingX to make auto-fit look nice instead of cramped. We may want to expose this somehow.
    const float min_column_width = TableGetMinColumnWidth();

    int count_fixed = 0;
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    table->LeftMostStretchedColumnDisplayOrder = -1;
    table->ColumnsAutoFitWidth = 0.0f;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float column_content_width_rows = (float)ImMax(column->ContentWidthRowsFrozen, column->ContentWidthRowsUnfrozen);
        const float column_content_width_headers = (float)column->ContentWidthHeadersIdeal;
        float column_width_ideal = column_content_width_rows;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            column_width_ideal = ImMax(column_width_ideal, column_content_width_headers);
        column_width_ideal = ImMax(column_width_ideal + padding_auto_x, min_column_width);
        table->ColumnsAutoFitWidth += column_width_ideal;

        if (column->Flags & (ImGuiTableColumnFlags_WidthAlwaysAutoResize | ImGuiTableColumnFlags_WidthFixed))
        {
            // Latch initial size for fixed columns
            count_fixed += 1;
            const bool auto_fit = (column->AutoFitQueue != 0x00) || (column->Flags & ImGuiTableColumnFlags_WidthAlwaysAutoResize);
            if (auto_fit)
            {
                column->WidthRequest = column_width_ideal;

                // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
                // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
                // large height (= first frame scrollbar display very off + clipper would skip lots of items).
                // This is merely making the side-effect less extreme, but doesn't properly fixes it.
                // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
                if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                    column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f);
            }
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const int init_size = (column->WidthStretchWeight < 0.0f);
            if (init_size)
                column->WidthStretchWeight = 1.0f;
            sum_weights_stretched += column->WidthStretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
    }

    // CellSpacingX is >0.0f when there's no vertical border, in which case we add two extra CellSpacingX to make auto-fit look nice instead of cramped.
    // We may want to expose this somehow.
    table->ColumnsAutoFitWidth += spacing_auto_x * (table->ColumnsVisibleCount - 1);

    // Layout
    const float width_spacings = table->CellSpacingX * (table->ColumnsVisibleCount - 1);
    float width_avail;
    if ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f)
        width_avail = table->InnerClipRect.GetWidth() - width_spacings;
    else
        width_avail = work_rect.GetWidth() - width_spacings;
    const float width_avail_for_stretched_columns = width_avail - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // WidthStretchWeight gets converted into WidthRequest
            float weight_ratio = column->WidthStretchWeight / sum_weights_stretched;
            column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
            width_remaining_for_stretched_columns -= column->WidthRequest;

            // [Resize Rule 2] Resizing from right-side of a weighted column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven;
    }

#if 0
    const float width_excess = table->ColumnsTotalWidth - work_rect.GetWidth();
    if ((table->Flags & ImGuiTableFlags_SizingPolicyStretchX) && width_excess > 0.0f)
    {
        // Shrink widths when the total does not fit
        // FIXME-TABLE: This is working but confuses/conflicts with manual resizing.
        // FIXME-TABLE: Policy to shrink down below below ideal/requested width if there's no room?
        g.ShrinkWidthBuffer.resize(table->ColumnsVisibleCount);
        for (int order_n = 0, visible_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            const int column_n = table->DisplayOrder[order_n];
            g.ShrinkWidthBuffer[visible_n].Index = column_n;
            g.ShrinkWidthBuffer[visible_n].Width = table->Columns[column_n].WidthGiven;
            visible_n++;
        }
        ShrinkWidths(g.ShrinkWidthBuffer.Data, g.ShrinkWidthBuffer.Size, width_excess);
        for (int n = 0; n < g.ShrinkWidthBuffer.Size; n++)
            table->Columns[g.ShrinkWidthBuffer.Data[n].Index].WidthGiven = ImMax(g.ShrinkWidthBuffer.Data[n].Width, min_column_size);
        // FIXME: Need to alter table->ColumnsTotalWidth
    }
    else
#endif

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    // FIXME-TABLE: May be simpler to store floating width and floor final positions only
    // FIXME-TABLE: Make it optional? User might prefer to preserve pixel perfect same size?
    if (width_remaining_for_stretched_columns >= 1.0f)
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    ImRect host_clip_rect = table->InnerClipRect;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = offset_x;
            column->StartXRows = column->StartXHeaders = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.x = offset_x;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.x = offset_x;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->SkipItems = true;
            continue;
        }

        float max_x = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
                max_x = table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_width;
        }
        else
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            if (!(table->Flags & ImGuiTableFlags_NoKeepColumnsVisible))
                max_x = table->WorkRect.Max.x - (table->ColumnsVisibleCount - (column->IndexWithinVisibleSet + 1)) * min_column_width;
        }
        if (offset_x + column->WidthGiven > max_x)
            column->WidthGiven = ImMax(max_x - offset_x, min_column_width);

        column->MinX = offset_x;
        column->MaxX = column->MinX + column->WidthGiven;

        //// A one pixel padding on the right side makes clipping more noticeable and contents look less cramped.
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX;// -1.0f;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n);  // Columns with the _WidthAlwaysAutoResize sizing policy will never be updated then.

        column->SkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Starting cursor position
        column->StartXRows = column->StartXHeaders = column->MinX + table->CellPaddingX1;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->StartXRows = ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->StartXRows = ImLerp(column->StartXRows, ImMax(column->StartXRows, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        const float initial_max_pos_x = column->MinX + table->CellPaddingX1;
        column->ContentMaxPosRowsFrozen = column->ContentMaxPosRowsUnfrozen = initial_max_pos_x;
        column->ContentMaxPosHeadersUsed = column->ContentMaxPosHeadersIdeal = initial_max_pos_x;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + 2.0f);

        offset_x += column->WidthGiven + table->CellSpacingX;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAlwaysAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClipX)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, 1);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}